

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByName
          (Registry *this,string *aName,Network *aRet)

{
  Status SVar1;
  Network nwk;
  undefined1 auStack_78 [8];
  _Alloc_hider local_70;
  char local_60 [32];
  _Alloc_hider local_40;
  char local_30 [24];
  
  Network::Network((Network *)auStack_78);
  std::__cxx11::string::_M_assign((string *)&local_70);
  SVar1 = LookupOne(this,(Network *)auStack_78,aRet);
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkByName(const std::string &aName, Network &aRet)
{
    Network nwk{};
    nwk.mName = aName;
    return LookupOne(nwk, aRet);
}